

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TransRangeSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TransRangeSyntax *this,size_t index)

{
  SyntaxNode *local_40;
  size_t index_local;
  TransRangeSyntax *this_local;
  
  if (index == 0) {
    local_40 = (SyntaxNode *)0x0;
    if (this != (TransRangeSyntax *)0xfffffffffffffff0) {
      local_40 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->repeat->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TransRangeSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &items;
        case 1: return repeat;
        default: return nullptr;
    }
}